

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupWithConstr(Gia_Man_t *p)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  Vec_Int_t *vSuper;
  int *piVar9;
  Gia_Man_t *p_00;
  size_t sVar10;
  char *pcVar11;
  Gia_Obj_t *pGVar12;
  Gia_Man_t *pGVar13;
  char *pcVar14;
  long lVar15;
  uint uVar16;
  uint local_44;
  int local_40;
  
  iVar6 = p->vCos->nSize;
  if (iVar6 - p->nRegs != 1) {
    __assert_fail("Gia_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                  ,0xbfa,"Gia_Man_t *Gia_ManDupWithConstr(Gia_Man_t *)");
  }
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                  ,0xbfb,"Gia_Man_t *Gia_ManDupWithConstr(Gia_Man_t *)");
  }
  if (iVar6 < 1) {
LAB_00681b2f:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar7 = *p->vCos->pArray;
  lVar8 = (long)(int)uVar7;
  if ((lVar8 < 0) || (p->nObjs <= (int)uVar7)) {
LAB_00681b8c:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar16 = *(uint *)(p->pObjs + lVar8);
  if ((uVar16 >> 0x1d & 1) == 0) {
    if (p->nObjs <= (int)uVar7) {
LAB_00681bab:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    if (uVar7 != (uVar16 & 0x1fffffff)) {
      pGVar3 = p->pObjs + lVar8;
      vSuper = (Vec_Int_t *)malloc(0x10);
      vSuper->nCap = 100;
      vSuper->nSize = 0;
      piVar9 = (int *)malloc(400);
      vSuper->pArray = piVar9;
      uVar7 = (uint)*(undefined8 *)pGVar3;
      Gia_ManDupWithConstrCollectAnd_rec
                (p,(Gia_Obj_t *)
                   ((ulong)(uVar7 >> 0x1d & 1) ^ (ulong)(pGVar3 + -(ulong)(uVar7 & 0x1fffffff))),
                 vSuper,1);
      if (vSuper->nSize < 2) {
        __assert_fail("Vec_IntSize(vSuper) > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                      ,0xc09,"Gia_Man_t *Gia_ManDupWithConstr(Gia_Man_t *)");
      }
      Gia_ManLevelNum(p);
      if (vSuper->nSize < 1) {
        local_44 = 0xffffffff;
      }
      else {
        local_40 = -1;
        lVar8 = 0;
        local_44 = 0xffffffff;
        do {
          uVar7 = vSuper->pArray[lVar8];
          if ((int)uVar7 < 0) goto LAB_00681b4e;
          uVar16 = uVar7 >> 1;
          pVVar2 = p->vLevels;
          Vec_IntFillExtra(pVVar2,uVar16 + 1,0);
          if (pVVar2->nSize <= (int)uVar16) goto LAB_00681b2f;
          if (local_40 < pVVar2->pArray[uVar16]) {
            pVVar2 = p->vLevels;
            Vec_IntFillExtra(pVVar2,uVar16 + 1,0);
            if (pVVar2->nSize <= (int)uVar16) goto LAB_00681b2f;
            local_40 = pVVar2->pArray[uVar16];
            local_44 = uVar7;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < vSuper->nSize);
      }
      if (local_44 == 0xffffffff) {
        __assert_fail("iLitBest != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                      ,0xc0f,"Gia_Man_t *Gia_ManDupWithConstr(Gia_Man_t *)");
      }
      p_00 = Gia_ManStart(p->nObjs);
      pcVar14 = p->pName;
      if (pcVar14 == (char *)0x0) {
        pcVar11 = (char *)0x0;
      }
      else {
        sVar10 = strlen(pcVar14);
        pcVar11 = (char *)malloc(sVar10 + 1);
        strcpy(pcVar11,pcVar14);
      }
      p_00->pName = pcVar11;
      pcVar14 = p->pSpec;
      if (pcVar14 == (char *)0x0) {
        pcVar11 = (char *)0x0;
      }
      else {
        sVar10 = strlen(pcVar14);
        pcVar11 = (char *)malloc(sVar10 + 1);
        strcpy(pcVar11,pcVar14);
      }
      p_00->pSpec = pcVar11;
      p->pObjs->Value = 0;
      Gia_ManHashAlloc(p_00);
      if (1 < p->nObjs) {
        lVar8 = 1;
        lVar15 = 0x14;
        do {
          pGVar3 = p->pObjs;
          uVar4 = *(ulong *)((long)pGVar3 + lVar15 + -8);
          if ((uVar4 & 0x1fffffff) == 0x1fffffff || (int)(uint)uVar4 < 0) {
            if (((uint)uVar4 & 0x9fffffff) == 0x9fffffff) {
              pGVar12 = Gia_ManAppendObj(p_00);
              uVar4 = *(ulong *)pGVar12;
              *(ulong *)pGVar12 = uVar4 | 0x9fffffff;
              *(ulong *)pGVar12 =
                   uVar4 & 0xe0000000ffffffff | 0x9fffffff |
                   (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
              pGVar5 = p_00->pObjs;
              if ((pGVar5 <= pGVar12) && (pGVar12 < pGVar5 + p_00->nObjs)) {
                Vec_IntPush(p_00->vCis,
                            (int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * -0x55555555);
                pGVar5 = p_00->pObjs;
                if ((pGVar5 <= pGVar12) && (pGVar12 < pGVar5 + p_00->nObjs)) {
                  iVar6 = (int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * 0x55555556;
                  goto LAB_006819c1;
                }
              }
              goto LAB_00681bab;
            }
          }
          else {
            uVar7 = *(uint *)((long)pGVar3 +
                             lVar15 + (ulong)(uint)((int)(uVar4 & 0x1fffffff) << 2) * -3);
            if (((int)uVar7 < 0) ||
               (uVar16 = *(uint *)((long)pGVar3 +
                                  lVar15 + (ulong)((uint)(uVar4 >> 0x1e) & 0x7ffffffc) * -3),
               (int)uVar16 < 0)) goto LAB_00681b6d;
            iVar6 = Gia_ManHashAnd(p_00,uVar7 ^ (uint)(uVar4 >> 0x1d) & 1,
                                   uVar16 ^ (uint)(uVar4 >> 0x3d) & 1);
LAB_006819c1:
            *(int *)(&pGVar3->field_0x0 + lVar15) = iVar6;
          }
          lVar8 = lVar8 + 1;
          lVar15 = lVar15 + 0xc;
        } while (lVar8 < p->nObjs);
      }
      if (vSuper->nSize < 1) {
        uVar7 = 0xffffffff;
      }
      else {
        uVar7 = 0xffffffff;
        lVar8 = 0;
        do {
          uVar16 = vSuper->pArray[lVar8];
          if (uVar16 != local_44) {
            if (uVar7 == 0xffffffff) {
              if ((int)uVar16 < 0) goto LAB_00681b4e;
              if (p->nObjs <= (int)(uVar16 >> 1)) goto LAB_00681b8c;
              uVar7 = p->pObjs[uVar16 >> 1].Value;
              if ((int)uVar7 < 0) goto LAB_00681b6d;
              uVar7 = uVar7 ^ uVar16 & 1;
            }
            else {
              if ((int)uVar16 < 0) goto LAB_00681b4e;
              if (p->nObjs <= (int)(uVar16 >> 1)) goto LAB_00681b8c;
              uVar1 = p->pObjs[uVar16 >> 1].Value;
              if ((int)uVar1 < 0) goto LAB_00681b6d;
              uVar7 = Gia_ManHashAnd(p_00,uVar7,uVar1 ^ uVar16 & 1);
            }
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < vSuper->nSize);
      }
      if ((int)local_44 < 0) {
LAB_00681b4e:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10c,"int Abc_Lit2Var(int)");
      }
      if ((int)(local_44 >> 1) < p->nObjs) {
        uVar16 = p->pObjs[local_44 >> 1].Value;
        if (-1 < (int)uVar16) {
          Gia_ManAppendCo(p_00,uVar16 ^ local_44 & 1);
          if (-1 < (int)uVar7) {
            Gia_ManAppendCo(p_00,uVar7 ^ 1);
            p_00->nConstrs = 1;
            pGVar13 = Gia_ManCleanup(p_00);
            Gia_ManStop(p_00);
            if (vSuper->pArray != (int *)0x0) {
              free(vSuper->pArray);
              vSuper->pArray = (int *)0x0;
            }
            free(vSuper);
            return pGVar13;
          }
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10e,"int Abc_LitNot(int)");
        }
LAB_00681b6d:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10f,"int Abc_LitNotCond(int, int)");
      }
      goto LAB_00681b8c;
    }
    pcVar14 = "The miter\'s output is a constant.";
  }
  else {
    pcVar14 = "The miter\'s output is not AND-decomposable.";
  }
  puts(pcVar14);
  return (Gia_Man_t *)0x0;
}

Assistant:

Gia_Man_t * Gia_ManDupWithConstr( Gia_Man_t * p )
{
    Vec_Int_t * vSuper;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iDriver, iLit, iLitBest = -1, LevelBest = -1;
    assert( Gia_ManPoNum(p) == 1 );
    assert( Gia_ManRegNum(p) == 0 );
    pObj = Gia_ManPo( p, 0 );
    if ( Gia_ObjFaninC0(pObj) )
    {
        printf( "The miter's output is not AND-decomposable.\n" );
        return NULL;
    }
    if ( Gia_ObjFaninId0p(p, pObj) == 0 )
    {
        printf( "The miter's output is a constant.\n" );
        return NULL;
    }
    vSuper = Vec_IntAlloc( 100 );
    Gia_ManDupWithConstrCollectAnd_rec( p, Gia_ObjChild0(pObj), vSuper, 1 );
    assert( Vec_IntSize(vSuper) > 1 );
    // find the highest level
    Gia_ManLevelNum( p );
    Vec_IntForEachEntry( vSuper, iLit, i )
        if ( LevelBest < Gia_ObjLevelId(p, Abc_Lit2Var(iLit)) )
            LevelBest = Gia_ObjLevelId(p, Abc_Lit2Var(iLit)), iLitBest = iLit;
    assert( iLitBest != -1 );
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    // create AND of nodes
    iDriver = -1;
    Vec_IntForEachEntry( vSuper, iLit, i )
    {
        if ( iLit == iLitBest )
            continue;
        if ( iDriver == -1 )
            iDriver = Gia_ObjLitCopy(p, iLit);
        else
            iDriver = Gia_ManHashAnd( pNew, iDriver, Gia_ObjLitCopy(p, iLit) );
    }
    // create the main PO
    Gia_ManAppendCo( pNew, Gia_ObjLitCopy(p, iLitBest) );
    // create the constraint PO
    Gia_ManAppendCo( pNew, Abc_LitNot(iDriver) );
    pNew->nConstrs = 1;
    // rehash
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    Vec_IntFree( vSuper );
    return pNew;

}